

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Designator_PDU.cpp
# Opt level: O0

void __thiscall KDIS::PDU::Designator_PDU::Encode(Designator_PDU *this,KDataStream *stream)

{
  KDataStream *pKVar1;
  KDataStream *stream_local;
  Designator_PDU *this_local;
  
  Header7::Encode(&this->super_Header,stream);
  pKVar1 = DATA_TYPE::operator<<(stream,(DataTypeBase *)&this->m_DesignatingEntityID);
  pKVar1 = KDataStream::operator<<(pKVar1,this->m_ui16CodeName);
  pKVar1 = DATA_TYPE::operator<<(pKVar1,(DataTypeBase *)&this->m_DesignatedEntityID);
  pKVar1 = KDataStream::operator<<(pKVar1,this->m_ui16Code);
  pKVar1 = KDataStream::operator<<(pKVar1,(float)this->m_f32Power);
  pKVar1 = KDataStream::operator<<(pKVar1,(float)this->m_f32WaveLength);
  pKVar1 = DATA_TYPE::operator<<(pKVar1,&(this->m_SpotRegardsToEntity).super_DataTypeBase);
  pKVar1 = DATA_TYPE::operator<<(pKVar1,&(this->m_SpotLocation).super_DataTypeBase);
  pKVar1 = KDataStream::operator<<(pKVar1,this->m_ui8DeadReckoningAlgorithm);
  pKVar1 = KDataStream::operator<<(pKVar1,this->m_ui16Padding1);
  pKVar1 = KDataStream::operator<<(pKVar1,this->m_ui8Padding2);
  DATA_TYPE::operator<<(pKVar1,&(this->m_EntityLinearAcceleration).super_DataTypeBase);
  return;
}

Assistant:

void Designator_PDU::Encode( KDataStream & stream ) const
{
    Header::Encode( stream );

    stream << KDIS_STREAM m_DesignatingEntityID
           << m_ui16CodeName
           << KDIS_STREAM m_DesignatedEntityID
           << m_ui16Code
           << m_f32Power
           << m_f32WaveLength
           << KDIS_STREAM m_SpotRegardsToEntity
           << KDIS_STREAM m_SpotLocation
           << m_ui8DeadReckoningAlgorithm
           << m_ui16Padding1
           << m_ui8Padding2
           << KDIS_STREAM m_EntityLinearAcceleration;
}